

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f *
Matrix4f::orthographicProjection
          (Matrix4f *__return_storage_ptr__,float width,float height,float zNear,float zFar,
          bool directX)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  
  Matrix4f(__return_storage_ptr__,0.0);
  __return_storage_ptr__->m_elements[0] = 2.0 / width;
  __return_storage_ptr__->m_elements[5] = 2.0 / height;
  auVar2._8_4_ = 0xbf800000;
  auVar2._0_8_ = 0xbf800000bf800000;
  auVar2._12_4_ = 0xbf800000;
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  uVar1 = vmovlps_avx(auVar2);
  *(undefined8 *)(__return_storage_ptr__->m_elements + 0xc) = uVar1;
  __return_storage_ptr__->m_elements[10] =
       (float)((uint)directX * 0x3f800000 + (uint)!directX * 0x40000000) / (zNear - zFar);
  __return_storage_ptr__->m_elements[0xe] =
       (float)((uint)directX * (int)zNear + (uint)!directX * (int)(zNear + zFar)) / (zNear - zFar);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::orthographicProjection( float width, float height, float zNear, float zFar, bool directX )
{
	Matrix4f m;

	m( 0, 0 ) = 2.0f / width;
	m( 1, 1 ) = 2.0f / height;
	m( 3, 3 ) = 1.0f;

	m( 0, 3 ) = -1;
	m( 1, 3 ) = -1;

	if( directX )
	{
		m( 2, 2 ) = 1.0f / ( zNear - zFar );
		m( 2, 3 ) = zNear / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = 2.0f / ( zNear - zFar );
		m( 2, 3 ) = ( zNear + zFar ) / ( zNear - zFar );
	}

	return m;
}